

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char8_t * fmt::v5::internal::
          parse_arg_id<fmt::v5::char8_t,fmt::v5::internal::precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>,fmt::v5::char8_t>>>&,fmt::v5::char8_t>>
                    (char8_t *begin,char8_t *end,
                    precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>_&,_fmt::v5::char8_t>
                    *handler)

{
  char8_t cVar1;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>
  *psVar2;
  basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>
  *this;
  type tVar3;
  char8_t *pcVar4;
  char8_t *pcVar5;
  uint arg_id;
  char8_t *pcVar6;
  basic_format_specs<fmt::v5::char8_t> *pbVar7;
  basic_string_view<fmt::v5::char8_t> name;
  error_handler local_71;
  precision_checker<fmt::v5::internal::error_handler> local_70;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_1
  local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_1
  local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  
  cVar1 = *begin;
  if ((cVar1 == 0x7d) || (cVar1 == 0x3a)) {
    pbVar7 = (handler->handler->
             super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
             ).super_specs_setter<fmt::v5::char8_t>.specs_;
    basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>
    ::next_arg((format_arg *)&local_68.string,
               (handler->handler->
               super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
               ).context_);
LAB_00216077:
    local_38 = local_58;
    uStack_30 = uStack_50;
    local_48.long_long_value = local_68.long_long_value;
    local_48.string.size = local_68.string.size;
    local_70.handler_ = &local_71;
    tVar3 = visit_format_arg<fmt::v5::internal::precision_checker<fmt::v5::internal::error_handler>,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>,fmt::v5::char8_t>>
                      (&local_70,
                       (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                        *)&local_48.string);
    if ((tVar3 & 0xffffffff80000000) != 0) {
      error_handler::on_error(&local_71,"number is too big");
    }
    (pbVar7->super_core_format_specs).precision = (int)tVar3;
  }
  else {
    if ((byte)(cVar1 - 0x30) < 10) {
      begin = begin + 1;
      arg_id = 0;
      pcVar5 = begin;
      if (cVar1 != 0x30) {
        while (arg_id < 0xccccccd) {
          arg_id = ((uint)pcVar5[-1] + arg_id * 10) - 0x30;
          begin = end;
          if ((pcVar5 == end) ||
             (cVar1 = *pcVar5, begin = pcVar5, pcVar5 = pcVar5 + 1, 9 < (byte)(cVar1 - 0x30)))
          goto LAB_002161d9;
        }
        arg_id = 0x80000000;
        begin = pcVar5 + -1;
LAB_002161d9:
        if ((int)arg_id < 0) {
          error_handler::on_error
                    ((error_handler *)
                     (handler->handler->
                     super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                     ).context_,"number is too big");
        }
      }
      if ((begin != end) && ((*begin == 0x3a || (*begin == 0x7d)))) {
        psVar2 = handler->handler;
        pbVar7 = (psVar2->
                 super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                 ).super_specs_setter<fmt::v5::char8_t>.specs_;
        this = (psVar2->
               super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
               ).context_;
        if ((this->
            super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>,_fmt::v5::char8_t>
            ).parse_context_.next_arg_id_ < 1) {
          (this->
          super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>,_fmt::v5::char8_t>
          ).parse_context_.next_arg_id_ = -1;
        }
        else {
          error_handler::on_error
                    ((error_handler *)this,
                     "cannot switch from automatic to manual argument indexing");
        }
        context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>,_fmt::v5::char8_t>
        ::do_get_arg((format_arg *)&local_68.string,
                     &((psVar2->
                       super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                       ).context_)->
                      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>,_fmt::v5::char8_t>
                     ,arg_id);
        goto LAB_00216077;
      }
    }
    else if ((cVar1 == 0x5f) || ((byte)((cVar1 & 0xdf) + 0xbf) < 0x1a)) {
      pcVar5 = begin + 1;
      do {
        pcVar4 = pcVar5;
        pcVar6 = end;
        if (pcVar4 == end) break;
        cVar1 = *pcVar4;
        pcVar5 = pcVar4 + 1;
      } while ((((byte)(cVar1 - 0x30) < 10) || (cVar1 == 0x5f)) ||
              (pcVar6 = pcVar4, (byte)((cVar1 & 0xdf) + 0xbf) < 0x1a));
      name.size_ = (long)pcVar6 - (long)begin;
      pbVar7 = (handler->handler->
               super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
               ).super_specs_setter<fmt::v5::char8_t>.specs_;
      name.data_ = begin;
      basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>
      ::get_arg((format_arg *)&local_68.string,
                (handler->handler->
                super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                ).context_,name);
      local_38 = local_58;
      uStack_30 = uStack_50;
      local_48.long_long_value = local_68.long_long_value;
      local_48.string.size = local_68.string.size;
      local_70.handler_ = &local_71;
      tVar3 = visit_format_arg<fmt::v5::internal::precision_checker<fmt::v5::internal::error_handler>,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>,fmt::v5::char8_t>>
                        (&local_70,
                         (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                          *)&local_48.string);
      if ((tVar3 & 0xffffffff80000000) != 0) {
        error_handler::on_error(&local_71,"number is too big");
      }
      (pbVar7->super_core_format_specs).precision = (int)tVar3;
      return pcVar6;
    }
    error_handler::on_error
              ((error_handler *)
               (handler->handler->
               super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
               ).context_,"invalid format string");
  }
  return begin;
}

Assistant:

FMT_CONSTEXPR const Char *parse_arg_id(
    const Char *begin, const Char *end, IDHandler &&handler) {
  assert(begin != end);
  Char c = *begin;
  if (c == '}' || c == ':')
    return handler(), begin;
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(begin, end, handler);
    if (begin == end || (*begin != '}' && *begin != ':'))
      return handler.on_error("invalid format string"), begin;
    handler(index);
    return begin;
  }
  if (!is_name_start(c))
    return handler.on_error("invalid format string"), begin;
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}